

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O3

QIcon __thiscall QGenericUnixTheme::xdgFileIcon(QGenericUnixTheme *this,QFileInfo *fileInfo)

{
  char cVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QMimeType mimeType;
  QMimeDatabase mimeDatabase;
  QString local_70;
  QString local_58;
  undefined1 *local_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QMimeDatabase::QMimeDatabase((QMimeDatabase *)&local_38);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QMimeDatabase::mimeTypeForFile(&local_40,(QMimeDatabase *)&local_38,fileInfo,0);
  cVar1 = QMimeType::isValid();
  if (cVar1 == '\0') {
    QIcon::QIcon((QIcon *)this);
    goto LAB_0062e8bb;
  }
  QMimeType::iconName();
  if (local_58.d.size == 0) {
LAB_0062e83b:
    QMimeType::genericIconName();
    if (local_70.d.size == 0) {
      QIcon::QIcon((QIcon *)this);
    }
    else {
      QIcon::fromTheme((QIcon *)this,&local_70);
    }
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    (this->super_QPlatformTheme)._vptr_QPlatformTheme = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    QIcon::fromTheme((QIcon *)this,&local_58);
    bVar2 = QIcon::isNull((QIcon *)this);
    if (bVar2) {
      QIcon::~QIcon((QIcon *)this);
      goto LAB_0062e83b;
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0062e8bb:
  QMimeType::~QMimeType((QMimeType *)&local_40);
  QMimeDatabase::~QMimeDatabase((QMimeDatabase *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QIcon)(QIconPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QGenericUnixTheme::xdgFileIcon(const QFileInfo &fileInfo)
{
    QMimeDatabase mimeDatabase;
    QMimeType mimeType = mimeDatabase.mimeTypeForFile(fileInfo);
    if (!mimeType.isValid())
        return QIcon();
    const QString &iconName = mimeType.iconName();
    if (!iconName.isEmpty()) {
        QIcon icon = QIcon::fromTheme(iconName);
        if (!icon.isNull())
            return icon;
    }
    const QString &genericIconName = mimeType.genericIconName();
    return genericIconName.isEmpty() ? QIcon() : QIcon::fromTheme(genericIconName);
}